

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

double __thiscall
ON_PolyCurve::PolyCurveParameter(ON_PolyCurve *this,int segment_index,double segmentcurve_parameter)

{
  bool bVar1;
  ON_Curve *pOVar2;
  double x;
  double s;
  ON_Interval sdom;
  ON_Interval cdom;
  ON_Curve *segment_curve;
  double segmentcurve_parameter_local;
  int segment_index_local;
  ON_PolyCurve *this_local;
  
  pOVar2 = SegmentCurve(this,segment_index);
  if (pOVar2 == (ON_Curve *)0x0) {
    this_local = (ON_PolyCurve *)0xffe5f8bd9e331dd2;
  }
  else {
    (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
    _s = SegmentDomain(this,segment_index);
    bVar1 = ON_Interval::operator==((ON_Interval *)(sdom.m_t + 1),(ON_Interval *)&s);
    this_local = (ON_PolyCurve *)segmentcurve_parameter;
    if (!bVar1) {
      x = ON_Interval::NormalizedParameterAt((ON_Interval *)(sdom.m_t + 1),segmentcurve_parameter);
      this_local = (ON_PolyCurve *)ON_Interval::ParameterAt((ON_Interval *)&s,x);
    }
  }
  return (double)this_local;
}

Assistant:

double ON_PolyCurve::PolyCurveParameter(
  int segment_index,
  double segmentcurve_parameter
  ) const
{
  const ON_Curve* segment_curve = SegmentCurve(segment_index);
  if ( !segment_curve )
    return ON_UNSET_VALUE;
  ON_Interval cdom = segment_curve->Domain();
  ON_Interval sdom = SegmentDomain(segment_index);
  if ( cdom == sdom )
    return segmentcurve_parameter;
  double s = cdom.NormalizedParameterAt(segmentcurve_parameter);
  return sdom.ParameterAt(s);
}